

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O2

ssize_t flush_buffer(hFILE *fp)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  
  pcVar3 = fp->buffer;
  while( true ) {
    if (fp->begin <= pcVar3) {
      fp->begin = fp->buffer;
      return 0;
    }
    sVar1 = (*fp->backend->write)(fp,pcVar3,(long)fp->begin - (long)pcVar3);
    if (sVar1 < 0) break;
    pcVar3 = pcVar3 + sVar1;
    fp->offset = fp->offset + sVar1;
  }
  piVar2 = __errno_location();
  fp->has_errno = *piVar2;
  return sVar1;
}

Assistant:

static ssize_t flush_buffer(hFILE *fp)
{
    const char *buffer = fp->buffer;
    while (buffer < fp->begin) {
        ssize_t n = fp->backend->write(fp, buffer, fp->begin - buffer);
        if (n < 0) { fp->has_errno = errno; return n; }
        buffer += n;
        fp->offset += n;
    }

    fp->begin = fp->buffer;  // Leave the buffer empty
    return 0;
}